

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall pstd::pmr::monotonic_buffer_resource::release(monotonic_buffer_resource *this)

{
  bool bVar1;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *in_RDI;
  MemoryBlock *block_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *__range2_1;
  MemoryBlock *block;
  iterator __end2;
  iterator __begin2;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *__range2;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *in_stack_ffffffffffffff98;
  _List_node_base *in_stack_ffffffffffffffa8;
  _List_node_base *in_stack_ffffffffffffffb0;
  _Self local_40;
  _Self local_38;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *local_10;
  
  local_10 = in_RDI + 2;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ::begin(in_stack_ffffffffffffff98);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    local_28 = std::_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>::operator*
                         ((_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock> *)
                          0x7c99e9);
    memory_resource::deallocate
              ((memory_resource *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)in_RDI
               ,(size_t)in_stack_ffffffffffffff98);
    std::_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>::operator++(&local_18);
  }
  std::__cxx11::
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::clear(in_RDI);
  local_30 = in_RDI + 3;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ::begin(in_stack_ffffffffffffff98);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    std::_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>::operator*
              ((_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock> *)0x7c9a7a);
    memory_resource::deallocate
              ((memory_resource *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)in_RDI
               ,(size_t)in_stack_ffffffffffffff98);
    std::_List_iterator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>::operator++(&local_38);
  }
  std::__cxx11::
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::clear(in_RDI);
  memory_resource::deallocate
            ((memory_resource *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)in_RDI,
             (size_t)in_stack_ffffffffffffff98);
  memset(&stack0xffffffffffffffa8,0,0x10);
  MemoryBlock::MemoryBlock((MemoryBlock *)&stack0xffffffffffffffa8);
  in_RDI[1].
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = in_stack_ffffffffffffffa8;
  in_RDI[1].
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev = in_stack_ffffffffffffffb0;
  return;
}

Assistant:

void release() {
        for (const auto &block : usedBlocks)
            upstreamResource->deallocate(block.ptr, block.size);
        usedBlocks.clear();

        for (const auto &block : availableBlocks)
            upstreamResource->deallocate(block.ptr, block.size);
        availableBlocks.clear();

        upstreamResource->deallocate(currentBlock.ptr, currentBlock.size);
        currentBlock = MemoryBlock();
    }